

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsInter.c
# Opt level: O2

uint * Abc_NtkMfsInterplateTruth(Mfs_Man_t *p,int *pCands,int nCands,int fInvert)

{
  int iVar1;
  sat_solver *s;
  Sto_Man_t *pCnf;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  uint *puTruth;
  uint *local_38;
  
  s = Abc_MfsCreateSolverResub(p,pCands,nCands,fInvert);
  uVar3 = 0;
  iVar1 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,(long)p->pPars->nBTLimit,0,0,0);
  if (iVar1 == -1) {
    pCnf = (Sto_Man_t *)sat_solver_store_release(s);
    sat_solver_delete(s);
    piVar2 = Int_ManSetGlobalVars(p->pMan,nCands);
    uVar4 = 0;
    if (0 < nCands) {
      uVar4 = (ulong)(uint)nCands;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      iVar1 = Vec_IntEntry(p->vProjVarsCnf,(pCands[uVar3] >> 1) + p->pCnf->nVars * -2);
      piVar2[uVar3] = iVar1;
    }
    iVar1 = Int_ManInterpolate(p->pMan,pCnf,0,&local_38);
    Sto_ManFree(pCnf);
    if (iVar1 != nCands) {
      __assert_fail("nFanins == nCands",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/mfs/mfsInter.c"
                    ,0x10e,"unsigned int *Abc_NtkMfsInterplateTruth(Mfs_Man_t *, int *, int, int)");
    }
  }
  else {
    p->nTimeOuts = p->nTimeOuts + 1;
    local_38 = (uint *)0x0;
  }
  return local_38;
}

Assistant:

unsigned * Abc_NtkMfsInterplateTruth( Mfs_Man_t * p, int * pCands, int nCands, int fInvert )
{
    sat_solver * pSat;
    Sto_Man_t * pCnf = NULL;
    unsigned * puTruth;
    int nFanins, status;
    int c, i, * pGloVars;

    // derive the SAT solver for interpolation
    pSat = Abc_MfsCreateSolverResub( p, pCands, nCands, fInvert );

    // solve the problem
    status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)p->pPars->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( status != l_False )
    {
        p->nTimeOuts++;
        return NULL;
    }
    // get the learned clauses
    pCnf = (Sto_Man_t *)sat_solver_store_release( pSat );
    sat_solver_delete( pSat );

    // set the global variables
    pGloVars = Int_ManSetGlobalVars( p->pMan, nCands );
    for ( c = 0; c < nCands; c++ )
    {
        // get the variable number of this divisor
        i = lit_var( pCands[c] ) - 2 * p->pCnf->nVars;
        // get the corresponding SAT variable
        pGloVars[c] = Vec_IntEntry( p->vProjVarsCnf, i );
    }

    // derive the interpolant
    nFanins = Int_ManInterpolate( p->pMan, pCnf, 0, &puTruth );
    Sto_ManFree( pCnf );
    assert( nFanins == nCands );
    return puTruth;
}